

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::SourceArrayLoader::assignSourceValuesToFloatOrDoubleArray
          (SourceArrayLoader *this,SourceBase *sourceBase,FloatOrDoubleArray *floatOrDoubleArray)

{
  pointer *ppAVar1;
  pointer pAVar2;
  int iVar3;
  DoubleArray *pDVar4;
  
  iVar3 = (*sourceBase->_vptr_SourceBase[2])(sourceBase);
  if (iVar3 == 2) {
    floatOrDoubleArray->mType = DATA_TYPE_FLOAT;
    pDVar4 = (DoubleArray *)COLLADAFW::FloatOrDoubleArray::getFloatValues(floatOrDoubleArray);
  }
  else {
    iVar3 = (*sourceBase->_vptr_SourceBase[2])(sourceBase);
    if (iVar3 != 3) {
      return false;
    }
    floatOrDoubleArray->mType = DATA_TYPE_DOUBLE;
    pDVar4 = COLLADAFW::FloatOrDoubleArray::getDoubleValues(floatOrDoubleArray);
  }
  pAVar2 = sourceBase[1].mAccessor.
           super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar4->mData = *(double **)&sourceBase[1].mLoadedInputElements.mFlags;
  pDVar4->mCount = (size_t)pAVar2;
  pDVar4->mCapacity = (size_t)pAVar2;
  ppAVar1 = &sourceBase[1].mAccessor.
             super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(byte *)ppAVar1 = *(byte *)ppAVar1 & 0xfc;
  return true;
}

Assistant:

bool SourceArrayLoader::assignSourceValuesToFloatOrDoubleArray( SourceBase* sourceBase, COLLADAFW::FloatOrDoubleArray& floatOrDoubleArray )
	{
		if (sourceBase->getDataType() == SourceBase::DATA_TYPE_FLOAT)
		{
			floatOrDoubleArray.setType( COLLADAFW::FloatOrDoubleArray::DATA_TYPE_FLOAT);
			COLLADAFW::FloatArray* values = floatOrDoubleArray.getFloatValues();
			FloatSource* source = ( FloatSource* ) sourceBase;
			FloatArrayElement& arrayElement = source->getArrayElement();
			COLLADAFW::FloatArray& valuesArray = arrayElement.getValues();
			values->setData ( valuesArray.getData (), valuesArray.getCount () );
			valuesArray.yieldOwnerShip();
			return true;
		}
		else if (sourceBase->getDataType() == SourceBase::DATA_TYPE_DOUBLE)
		{
			floatOrDoubleArray.setType( COLLADAFW::FloatOrDoubleArray::DATA_TYPE_DOUBLE);
			COLLADAFW::DoubleArray* values = floatOrDoubleArray.getDoubleValues();
			DoubleSource* source = ( DoubleSource* ) sourceBase;
			DoubleArrayElement& arrayElement = source->getArrayElement();
			COLLADAFW::DoubleArray& valuesArray = arrayElement.getValues();
			values->setData ( valuesArray.getData (), valuesArray.getCount () );
			valuesArray.yieldOwnerShip();
			return true;
		}
		else
		{
			return false;
		}
	}